

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void menu_header(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte local_ad;
  char local_a8 [4];
  _Bool allow_floor;
  _Bool use_quiver;
  _Bool use_equip;
  _Bool use_inven;
  char out_val [75];
  char tmp_val [75];
  
  bVar1 = (item_mode & 2U) != 0;
  bVar2 = (item_mode & 1U) != 0;
  bVar3 = (item_mode & 8U) != 0;
  local_ad = 1;
  if (f2 < f1) {
    local_ad = allow_all;
  }
  local_ad = local_ad & 1;
  if (player->upkeep->command_wrk == L'\x02') {
    strnfmt(local_a8,0x4b,"Inven:");
    if (i1 <= i2) {
      strnfmt(out_val + 0x48,0x4b," %c-%c,",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i1],
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i2]);
      my_strcat(local_a8,out_val + 0x48,0x4b);
    }
    if (bVar2) {
      my_strcat(local_a8," / for Equip,",0x4b);
    }
    if (bVar3) {
      my_strcat(local_a8," | for Quiver,",0x4b);
    }
    if (local_ad != 0) {
      my_strcat(local_a8," - for floor,",0x4b);
    }
  }
  else if (player->upkeep->command_wrk == L'\x01') {
    strnfmt(local_a8,0x4b,"Equip:");
    if (e1 <= e2) {
      strnfmt(out_val + 0x48,0x4b," %c-%c,",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e1],
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e2]);
      my_strcat(local_a8,out_val + 0x48,0x4b);
    }
    if (bVar1) {
      my_strcat(local_a8," / for Inven,",0x4b);
    }
    if (bVar3) {
      my_strcat(local_a8," | for Quiver,",0x4b);
    }
    if (local_ad != 0) {
      my_strcat(local_a8," - for floor,",0x4b);
    }
  }
  else if (player->upkeep->command_wrk == L'\b') {
    strnfmt(local_a8,0x4b,"Quiver:");
    if (q1 <= q2) {
      strnfmt(out_val + 0x48,0x4b," %d-%d,",(ulong)(uint)q1,(ulong)(uint)q2);
      my_strcat(local_a8,out_val + 0x48,0x4b);
    }
    if (bVar1) {
      my_strcat(local_a8," / for Inven,",0x4b);
    }
    else if (bVar2) {
      my_strcat(local_a8," / for Equip,",0x4b);
    }
    if (local_ad != 0) {
      my_strcat(local_a8," - for floor,",0x4b);
    }
  }
  else if (player->upkeep->command_wrk == L'ࠀ') {
    strnfmt(local_a8,0x4b,"Throwing items:");
    if (throwing_num != L'\0') {
      strnfmt(out_val + 0x48,0x4b," a-%c,",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                                [throwing_num + L'\xffffffff']);
      my_strcat(local_a8,out_val + 0x48,0x4b);
    }
    if (bVar1) {
      my_strcat(local_a8," / for Inven,",0x4b);
    }
    if (bVar3) {
      my_strcat(local_a8," | for Quiver,",0x4b);
    }
    if (local_ad != 0) {
      my_strcat(local_a8," - for floor,",0x4b);
    }
  }
  else {
    strnfmt(local_a8,0x4b,"Floor:");
    if (f1 <= f2) {
      strnfmt(out_val + 0x48,0x4b," %c-%c,",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f1],
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f2]);
      my_strcat(local_a8,out_val + 0x48,0x4b);
    }
    if (bVar1) {
      my_strcat(local_a8," / for Inven,",0x4b);
    }
    else if (bVar2) {
      my_strcat(local_a8," / for Equip,",0x4b);
    }
    if (bVar3) {
      my_strcat(local_a8," | for Quiver,",0x4b);
    }
  }
  my_strcat(local_a8," ESC",0x4b);
  strnfmt(header,0x50,"(%s)",local_a8);
  return;
}

Assistant:

static void menu_header(void)
{
	char tmp_val[75];
	char out_val[75];

	bool use_inven = ((item_mode & USE_INVEN) ? true : false);
	bool use_equip = ((item_mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((item_mode & USE_QUIVER) ? true : false);
	bool allow_floor = ((f1 <= f2) || allow_all);

	/* Viewing inventory */
	if (player->upkeep->command_wrk == USE_INVEN) {
		/* Begin the header */
		strnfmt(out_val, sizeof(out_val), "Inven:");

		/* List choices */
		if (i1 <= i2) {
			/* Build the header */
			strnfmt(tmp_val, sizeof(tmp_val), " %c-%c,",
				all_letters_nohjkl[i1], all_letters_nohjkl[i2]);

			/* Append */
			my_strcat(out_val, tmp_val, sizeof(out_val));
		}

		/* Indicate legality of equipment */
		if (use_equip)
			my_strcat(out_val, " / for Equip,", sizeof(out_val));

		/* Indicate legality of quiver */
		if (use_quiver)
			my_strcat(out_val, " | for Quiver,", sizeof(out_val));

		/* Indicate legality of the "floor" */
		if (allow_floor)
			my_strcat(out_val, " - for floor,", sizeof(out_val));
	}

	/* Viewing equipment */
	else if (player->upkeep->command_wrk == USE_EQUIP) {
		/* Begin the header */
		strnfmt(out_val, sizeof(out_val), "Equip:");

		/* List choices */
		if (e1 <= e2) {
			/* Build the header */
			strnfmt(tmp_val, sizeof(tmp_val), " %c-%c,",
				all_letters_nohjkl[e1], all_letters_nohjkl[e2]);

			/* Append */
			my_strcat(out_val, tmp_val, sizeof(out_val));
		}

		/* Indicate legality of inventory */
		if (use_inven)
			my_strcat(out_val, " / for Inven,", sizeof(out_val));

		/* Indicate legality of quiver */
		if (use_quiver)
			my_strcat(out_val, " | for Quiver,", sizeof(out_val));

		/* Indicate legality of the "floor" */
		if (allow_floor)
			my_strcat(out_val, " - for floor,", sizeof(out_val));
	}

	/* Viewing quiver */
	else if (player->upkeep->command_wrk == USE_QUIVER) {
		/* Begin the header */
		strnfmt(out_val, sizeof(out_val), "Quiver:");

		/* List choices */
		if (q1 <= q2) {
			/* Build the header */
			strnfmt(tmp_val, sizeof(tmp_val), " %d-%d,", q1, q2);

			/* Append */
			my_strcat(out_val, tmp_val, sizeof(out_val));
		}

		/* Indicate legality of inventory or equipment */
		if (use_inven)
			my_strcat(out_val, " / for Inven,", sizeof(out_val));
		else if (use_equip)
			my_strcat(out_val, " / for Equip,", sizeof(out_val));

		/* Indicate legality of the "floor" */
		if (allow_floor)
			my_strcat(out_val, " - for floor,", sizeof(out_val));
	}

	/* Viewing throwing */
	else if (player->upkeep->command_wrk == SHOW_THROWING) {
		/* Begin the header */
		strnfmt(out_val, sizeof(out_val), "Throwing items:");

		/* List choices */
		if (throwing_num) {
			/* Build the header */
			strnfmt(tmp_val, sizeof(tmp_val),  " a-%c,",
				all_letters_nohjkl[throwing_num - 1]);

			/* Append */
			my_strcat(out_val, tmp_val, sizeof(out_val));
		}

		/* Indicate legality of inventory */
		if (use_inven)
			my_strcat(out_val, " / for Inven,", sizeof(out_val));

		/* Indicate legality of quiver */
		if (use_quiver)
			my_strcat(out_val, " | for Quiver,", sizeof(out_val));

		/* Indicate legality of the "floor" */
		if (allow_floor)
			my_strcat(out_val, " - for floor,", sizeof(out_val));
	}

	/* Viewing floor */
	else {
		/* Begin the header */
		strnfmt(out_val, sizeof(out_val), "Floor:");

		/* List choices */
		if (f1 <= f2) {
			/* Build the header */
			strnfmt(tmp_val, sizeof(tmp_val), " %c-%c,",
				all_letters_nohjkl[f1], all_letters_nohjkl[f2]);

			/* Append */
			my_strcat(out_val, tmp_val, sizeof(out_val));
		}

		/* Indicate legality of inventory or equipment */
		if (use_inven)
			my_strcat(out_val, " / for Inven,", sizeof(out_val));
		else if (use_equip)
			my_strcat(out_val, " / for Equip,", sizeof(out_val));

		/* Indicate legality of quiver */
		if (use_quiver)
			my_strcat(out_val, " | for Quiver,", sizeof(out_val));
	}

	/* Finish the header */
	my_strcat(out_val, " ESC", sizeof(out_val));

	/* Build the header */
	strnfmt(header, sizeof(header), "(%s)", out_val);
}